

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O2

uint32 __thiscall
TTD::UnorderedArrayList<TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo,_128UL>::Count
          (UnorderedArrayList<TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo,_128UL> *this)

{
  ulong uVar1;
  uint32 uVar2;
  
  uVar1 = (long)(this->m_inlineHeadBlock).CurrPos - (long)(this->m_inlineHeadBlock).BlockData;
  if (uVar1 < 0x3870) {
    uVar2 = (uint32)(ushort)((ushort)uVar1 / 0x70);
    while( true ) {
      this = (UnorderedArrayList<TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo,_128UL> *)
             (this->m_inlineHeadBlock).Next;
      if (this == (UnorderedArrayList<TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo,_128UL>
                   *)0x0) {
        return uVar2;
      }
      uVar1 = (long)(this->m_inlineHeadBlock).CurrPos - (long)(this->m_inlineHeadBlock).BlockData;
      if (0x386f < uVar1) break;
      uVar2 = uVar2 + (ushort)uVar1 / 0x70;
    }
  }
  TTDAbort_unrecoverable_error("We somehow wrote in too much data.");
}

Assistant:

uint32 Count() const
        {
            size_t count = (((byte*)this->m_inlineHeadBlock.CurrPos) - ((byte*)this->m_inlineHeadBlock.BlockData)) / sizeof(T);
            TTDAssert(count <= allocSize, "We somehow wrote in too much data.");

            for (UnorderedArrayListLink* curr = this->m_inlineHeadBlock.Next; curr != nullptr; curr = curr->Next)
            {
                size_t ncount = (((byte*)curr->CurrPos) - ((byte*)curr->BlockData)) / sizeof(T);
                TTDAssert(ncount <= allocSize, "We somehow wrote in too much data.");

                count += ncount;
            }

            return (uint32)count;
        }